

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O2

void __thiscall fp_remover::classes::Character::~Character(Character *this)

{
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Character::~Character()
{

}